

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O0

wchar_t project_player_handler_POIS(project_player_handler_context_t *context)

{
  player *p;
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t cperc;
  source sVar3;
  source origin;
  wchar_t local_14;
  wchar_t dam;
  wchar_t xtra;
  project_player_handler_context_t *context_local;
  
  p = player;
  local_14 = L'\0';
  uVar2 = Rand_div(context->dam);
  _Var1 = player_inc_timed(p,L'\a',uVar2 + L'\v',true,true,true);
  if (!_Var1) {
    msg("You resist the effect!");
  }
  if (L';' < context->power) {
    uVar2 = Rand_div(context->dam);
    if ((200 < (int)uVar2) && (_Var1 = player_is_immune(player,L'\0'), !_Var1)) {
      cperc = context->dam / 5;
      msg("The venom stings your skin!");
      inven_damage(player,L'\0',cperc);
      local_14 = adjust_dam(player,L'\0',cperc,RANDOMISE,(int)(player->state).el_info[0].res_level,
                            true);
    }
    uVar2 = Rand_div(context->dam);
    if (200 < (int)uVar2) {
      msg("The stench sickens you.");
      sVar3 = source_none();
      origin.which = sVar3.which;
      origin._4_4_ = 0;
      origin.what = sVar3.what;
      effect_simple(L'\x11',origin,"0",L'\x04',L'\0',L'\0',L'\0',L'\0',&context->obvious);
    }
  }
  return local_14;
}

Assistant:

static int project_player_handler_POIS(project_player_handler_context_t *context)
{
	int xtra = 0;

	if (!player_inc_timed(player, TMD_POISONED, 10 + randint1(context->dam),
			true, true, true)) {
		msg("You resist the effect!");
	}

	/* Occasional side-effects for powerful poison attacks */
	if (context->power >= 60) {
		if (randint0(context->dam) > 200) {
			if (!player_is_immune(player, ELEM_ACID)) {
				int dam = context->dam / 5;
				msg("The venom stings your skin!");
				inven_damage(player, PROJ_ACID, dam);
				xtra += adjust_dam(player, PROJ_ACID, dam, RANDOMISE,
								 player->state.el_info[PROJ_ACID].res_level,
								 true);
			}
		}
		if (randint0(context->dam) > 200) {
			msg("The stench sickens you.");
			effect_simple(EF_DRAIN_STAT, source_none(), "0", STAT_CON, 0, 0, 0,
						  0, &context->obvious);
		}
	}
	return xtra;
}